

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O0

Kit_DsdMan_t * Kit_DsdManAlloc(int nVars,int nNodes)

{
  int iVar1;
  Kit_DsdMan_t *__s;
  Vec_Ptr_t *pVVar2;
  CloudManager *pCVar3;
  Vec_Int_t *pVVar4;
  Kit_DsdMan_t *p;
  int nNodes_local;
  int nVars_local;
  
  __s = (Kit_DsdMan_t *)malloc(0x30);
  memset(__s,0,0x30);
  __s->nVars = nVars;
  iVar1 = Kit_TruthWordNum(__s->nVars);
  __s->nWords = iVar1;
  pVVar2 = Vec_PtrAllocTruthTables(__s->nVars);
  __s->vTtElems = pVVar2;
  pVVar2 = Vec_PtrAllocSimInfo(nNodes,__s->nWords);
  __s->vTtNodes = pVVar2;
  pCVar3 = Cloud_Init(0x10,0xe);
  __s->dd = pCVar3;
  pVVar2 = Vec_PtrAllocSimInfo(0x1000,__s->nWords);
  __s->vTtBdds = pVVar2;
  pVVar4 = Vec_IntAlloc(0x200);
  __s->vNodes = pVVar4;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Allocates the DSD manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Kit_DsdMan_t * Kit_DsdManAlloc( int nVars, int nNodes )
{
    Kit_DsdMan_t * p;
    p = ABC_ALLOC( Kit_DsdMan_t, 1 );
    memset( p, 0, sizeof(Kit_DsdMan_t) );
    p->nVars    = nVars;
    p->nWords   = Kit_TruthWordNum( p->nVars );
    p->vTtElems = Vec_PtrAllocTruthTables( p->nVars );
    p->vTtNodes = Vec_PtrAllocSimInfo( nNodes, p->nWords );
    p->dd       = Cloud_Init( 16, 14 );
    p->vTtBdds  = Vec_PtrAllocSimInfo( (1<<12), p->nWords );
    p->vNodes   = Vec_IntAlloc( 512 );
    return p;
}